

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMNodeImpl::setOwnerDocument(DOMNodeImpl *this,DOMDocument *doc)

{
  bool bVar1;
  DOMNode *local_28;
  DOMDocument *doc_local;
  DOMNodeImpl *this_local;
  
  bVar1 = isOwned(this);
  if (!bVar1) {
    local_28 = (DOMNode *)0x0;
    if (doc != (DOMDocument *)0x0) {
      local_28 = &doc->super_DOMNode;
    }
    this->fOwnerNode = local_28;
  }
  return;
}

Assistant:

void DOMNodeImpl::setOwnerDocument(DOMDocument *doc) {
    // if we have an owner we rely on it to have it right
    // otherwise fOwnerNode is our ownerDocument
    if (!isOwned()) {
        // revisit.  Problem with storage for doctype nodes that were created
        //                on the system heap in advance of having a document.
        fOwnerNode = doc;
    }
}